

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

void __thiscall
pbrt::SimpleVolPathIntegrator::SimpleVolPathIntegrator
          (SimpleVolPathIntegrator *this,int maxDepth,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights)

{
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  *pTVar1;
  pointer pLVar2;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *__range1;
  _Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_60;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_48;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_40;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_38;
  
  local_38.bits =
       (camera->
       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
       ).bits;
  local_40.bits =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  local_48.bits =
       (aggregate->
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       ).bits;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_60,lights);
  RayIntegrator::RayIntegrator
            (&this->super_RayIntegrator,(CameraHandle *)&local_38,(SamplerHandle *)&local_40,
             (PrimitiveHandle *)&local_48,
             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_60);
  std::_Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~_Vector_base(&local_60)
  ;
  (this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__Integrator_02eeeb70;
  this->maxDepth = maxDepth;
  pLVar2 = (lights->super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>).
           _M_impl.super__Vector_impl_data._M_start;
  do {
    if (pLVar2 == (lights->super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    pTVar1 = &pLVar2->
              super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    ;
    pLVar2 = pLVar2 + 1;
  } while (1 < *(uint *)(pTVar1->bits & 0xffffffffffff));
  ErrorExit<>("SimpleVolPathIntegrator only supports area and infinite light sources");
}

Assistant:

SimpleVolPathIntegrator::SimpleVolPathIntegrator(int maxDepth, CameraHandle camera,
                                                 SamplerHandle sampler,
                                                 PrimitiveHandle aggregate,
                                                 std::vector<LightHandle> lights)
    : RayIntegrator(camera, sampler, aggregate, lights), maxDepth(maxDepth) {
    for (LightHandle light : lights) {
        if (IsDeltaLight(light.Type()))
            ErrorExit("SimpleVolPathIntegrator only supports area and infinite light "
                      "sources");
    }
}